

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_el.h
# Opt level: O0

size_type __thiscall lf::base::RefEl::NumNodes(RefEl *this)

{
  runtime_error *this_00;
  RefEl *this_local;
  
  switch(this->type_) {
  case kPoint:
    this_local._4_4_ = 1;
    break;
  case kSegment:
    this_local._4_4_ = 2;
    break;
  case kTria:
    this_local._4_4_ = 3;
    break;
  case kQuad:
    this_local._4_4_ = 4;
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"RefEl::NumNodes() not implemented for this RefEl type.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return this_local._4_4_;
}

Assistant:

[[nodiscard]] constexpr size_type NumNodes() const {
    switch (type_) {
      case RefElType::kPoint:
        return 1;
      case RefElType::kSegment:
        return 2;
      case RefElType::kTria:
        return 3;
      case RefElType::kQuad:
        return 4;
      default:
        throw std::runtime_error(
            "RefEl::NumNodes() not implemented for this RefEl type.");
    }
  }